

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

int hgeti4(char *hstring,char *keyword,int *ival)

{
  char *__s;
  size_t sVar1;
  double dVar2;
  char local_68 [8];
  char val [30];
  int minint;
  double dval;
  char *value;
  int *ival_local;
  char *keyword_local;
  char *hstring_local;
  
  __s = hgetc(hstring,keyword);
  if (__s == (char *)0x0) {
    hstring_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(__s);
    if (sVar1 < 0x1e) {
      strcpy(local_68,__s);
      dVar2 = atof(local_68);
      if (dVar2 + 0.001 <= 2147483647.0) {
        if (dVar2 < 0.0) {
          if (-2147483648.0 <= dVar2 - 0.001) {
            *ival = (int)(dVar2 - 0.001);
          }
          else {
            *ival = -0x80000000;
          }
        }
        else {
          *ival = (int)(dVar2 + 0.001);
        }
      }
      else {
        *ival = 0x7fffffff;
      }
      hstring_local._4_4_ = 1;
    }
    else {
      hstring_local._4_4_ = 0;
    }
  }
  return hstring_local._4_4_;
}

Assistant:

static int
hgeti4 (hstring,keyword,ival)

char *hstring;	/* character string containing FITS header information
		   in the format <keyword>= <value> {/ <comment>} */
char *keyword;	/* character string containing the name of the keyword
		   the value of which is returned.  hget searches for a
		   line beginning with this string.  if "[n]" is present,
		   the n'th token in the value is returned.
		   (the first 8 characters must be unique) */
int *ival;
{
char *value;
double dval;
int minint;
char val[30]; 

/* Get value and comment from header string */
	value = hgetc (hstring,keyword);

/* Translate value from ASCII to binary */
	if (value != NULL) {
	    minint = -MAXINT - 1;
            if (strlen(value) > 29)
               return(0);
	    strcpy (val, value);
	    dval = atof (val);
	    if (dval+0.001 > MAXINT)
		*ival = MAXINT;
	    else if (dval >= 0)
		*ival = (int) (dval + 0.001);
	    else if (dval-0.001 < minint)
		*ival = minint;
	    else
		*ival = (int) (dval - 0.001);
	    return (1);
	    }
	else {
	    return (0);
	    }
}